

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O2

void __thiscall HACD::MemoryChunkChunk::MemoryChunkChunk(MemoryChunkChunk *this)

{
  undefined8 *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  lVar2 = 0x40;
  do {
    *(undefined8 *)((long)this->mChunks + lVar2 + -0x20) = 0;
    *(undefined1 *)((long)this->mChunks + lVar2 + -0x40) = 0;
    *(undefined4 *)((long)this->mChunks + lVar2 + -0x18) = 0;
    *(undefined4 *)((long)this->mChunks + lVar2 + -0x28) = 0;
    puVar1 = (undefined8 *)((long)this->mChunks + lVar2 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x640);
  auVar3 = ZEXT416(0) << 0x40;
  this->mChunkSize = auVar3._0_4_;
  this->mMaxChunks = auVar3._4_4_;
  this->mNext = (MemoryChunkChunk *)auVar3._8_8_;
  return;
}

Assistant:

MemoryChunkChunk(void)
  {
    mNext = 0;
    mChunkSize = 0;
	mMaxChunks = 0;
  }